

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# split.cpp
# Opt level: O3

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* tlx::split(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *into,char *sep,size_t sep_size,string *str,size_type limit)

{
  int iVar1;
  size_type sVar2;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var3;
  pointer __s2;
  size_t __len;
  pointer pcVar4;
  pointer pcVar5;
  const_iterator it;
  const_iterator last;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_60;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_50;
  size_type local_48;
  char *local_40;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  
  local_40 = sep;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase_at_end(into,(into->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start);
  if (limit != 0) {
    local_48 = limit;
    if (sep_size == 0) {
      local_60._M_current = (str->_M_dataplus)._M_p;
      if (str->_M_string_length != 0) {
        do {
          local_58._M_current = local_60._M_current + 1;
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>&,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)into,
                     &local_60,&local_58);
          local_60._M_current = local_60._M_current + 1;
        } while (local_60._M_current != (str->_M_dataplus)._M_p + str->_M_string_length);
      }
    }
    else {
      __s2 = (str->_M_dataplus)._M_p;
      sVar2 = str->_M_string_length;
      pcVar5 = __s2 + sVar2;
      pcVar4 = __s2;
      local_60._M_current = __s2;
      local_58._M_current = __s2;
      local_50 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)into;
      local_38._M_current = pcVar5;
      if ((long)sep_size < (long)sVar2) {
        do {
          local_60._M_current = __s2;
          iVar1 = bcmp(local_40,__s2,sep_size);
          _Var3._M_current = __s2;
          if (iVar1 == 0) {
            local_38._M_current = pcVar5;
            if (local_48 <= (*(long *)(local_50 + 8) - *(long *)local_50 >> 5) + 1U) break;
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>&,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>&>
                      (local_50,&local_58,&local_60);
            local_58._M_current = local_60._M_current + sep_size;
            pcVar4 = (str->_M_dataplus)._M_p;
            sVar2 = str->_M_string_length;
            _Var3._M_current = local_60._M_current;
          }
          __s2 = _Var3._M_current + 1;
          pcVar5 = pcVar4 + sVar2;
          local_60._M_current = __s2;
          local_38._M_current = pcVar5;
        } while (_Var3._M_current + sep_size + 1 < pcVar5);
      }
      into = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_50;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>&,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                (local_50,&local_58,&local_38);
    }
  }
  return (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)(vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)into;
}

Assistant:

static inline
std::vector<std::string>& split(
    std::vector<std::string>* into,
    const char* sep, size_t sep_size, const std::string& str,
    std::string::size_type limit) {

    into->clear();
    if (limit == 0) return *into;

    if (sep_size == 0)
    {
        std::string::const_iterator it = str.begin();
        while (it != str.end()) {
            into->emplace_back(it, it + 1);
            ++it;
        }
        return *into;
    }

    std::string::const_iterator it = str.begin(), last = it;

    for ( ; it + sep_size < str.end(); ++it)
    {
        if (std::equal(sep, sep + sep_size, it))
        {
            if (into->size() + 1 >= limit)
            {
                into->emplace_back(last, str.end());
                return *into;
            }

            into->emplace_back(last, it);
            last = it + sep_size;
        }
    }

    into->emplace_back(last, str.end());

    return *into;
}